

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O3

bool duckdb::LikeEscapeOperator::Operation<duckdb::string_t,duckdb::string_t,duckdb::string_t>
               (string_t str,string_t pattern,string_t escape)

{
  char escape_00;
  bool bVar1;
  char *pdata;
  char *sdata;
  string_t escape_01;
  undefined8 local_50;
  char *local_48;
  undefined8 local_40;
  char *local_38;
  
  escape_01.value._8_8_ = pattern.value._0_8_;
  escape_01.value._0_8_ = escape.value._8_8_;
  local_50 = escape_01.value._8_8_;
  local_48 = pattern.value._8_8_;
  local_40 = str.value._0_8_;
  local_38 = str.value._8_8_;
  escape_00 = GetEscapeChar(escape.value._0_8_,escape_01);
  sdata = str.value._8_8_;
  if (str.value._0_4_ < 0xd) {
    sdata = (char *)((long)&local_40 + 4);
  }
  pdata = pattern.value._8_8_;
  if (pattern.value._0_4_ < 0xd) {
    pdata = (char *)((long)&local_50 + 4);
  }
  bVar1 = TemplatedLikeOperator<(char)37,(char)95,true,duckdb::StandardCharacterReader>
                    (sdata,str.value._0_8_ & 0xffffffff,pdata,escape_01.value._8_8_ & 0xffffffff,
                     escape_00);
  return bVar1;
}

Assistant:

static inline bool Operation(TA str, TB pattern, TC escape) {
		char escape_char = GetEscapeChar(escape);
		return LikeOperatorFunction(str.GetData(), str.GetSize(), pattern.GetData(), pattern.GetSize(), escape_char);
	}